

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O3

bool dxil_spv::emit_texture_store_instruction_dispatch
               (Impl *impl,CallInst *instruction,bool multi_sampled)

{
  CallInst *pCVar1;
  Builder *pBVar2;
  uint32_t count;
  bool bVar3;
  Id IVar4;
  Value *pVVar5;
  CallInst *pCVar6;
  mapped_type *pmVar7;
  Operation *this;
  Type *type;
  undefined7 in_register_00000011;
  ulong uVar8;
  uint index;
  uint i;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  Id image_id;
  Id coord [3];
  uint num_coords_full;
  Id write_values [4];
  Id local_7c;
  undefined4 local_78;
  Capability local_74;
  mapped_type *local_70;
  Id local_68 [4];
  Builder *local_58;
  uint32_t local_50;
  uint32_t local_4c;
  Id local_48 [6];
  
  local_58 = Converter::Impl::builder(impl);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar4 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  local_7c = IVar4;
  if (((impl->ags).num_instructions == 2) &&
     (pCVar1 = (impl->ags).backdoor_instructions[0],
     pCVar6 = (CallInst *)LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2),
     pCVar1 == pCVar6 && !multi_sampled)) {
    (impl->ags).active_uav_ptr = IVar4;
    (impl->ags).active_uav_op = TextureStore;
    return true;
  }
  local_78 = (undefined4)CONCAT71(in_register_00000011,multi_sampled);
  pmVar7 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&impl->handle_to_resource_meta,&local_7c);
  local_68[2] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_4c = 0;
  bVar3 = get_image_dimensions(impl,local_7c,&local_4c,&local_50);
  count = local_4c;
  bVar11 = local_4c < 4;
  if (bVar11 && bVar3) {
    uVar8 = (ulong)local_4c;
    local_70 = pmVar7;
    if (uVar8 != 0) {
      uVar9 = 0;
      do {
        pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar9 + 2);
        IVar4 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
        local_68[uVar9] = IVar4;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    lVar10 = 0;
    do {
      index = (int)lVar10 + 5;
      pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
      Converter::Impl::register_externally_visible_write(impl,pVVar5);
      pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
      local_48[lVar10] = IVar4;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    this = Converter::Impl::allocate(impl,OpImageWrite);
    Operation::add_id(this,local_7c);
    pBVar2 = local_58;
    IVar4 = spv::Builder::makeIntegerType(local_58,0x20,false);
    IVar4 = Converter::Impl::build_vector(impl,IVar4,local_68,count);
    Operation::add_id(this,IVar4);
    pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,5);
    type = LLVMBC::Value::getType(pVVar5);
    IVar4 = Converter::Impl::get_type_id(impl,type,0);
    IVar4 = Converter::Impl::build_vector(impl,IVar4,local_48,4);
    pmVar7 = local_70;
    IVar4 = Converter::Impl::fixup_store_type_typed(impl,local_70->component_type,4,IVar4);
    Operation::add_id(this,IVar4);
    local_74 = CapabilityStorageImageWriteWithoutFormat;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar2->capabilities,&local_74);
    if ((char)local_78 != '\0') {
      pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,10);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
      Operation::add_literal(this,0x40);
      pmVar7 = local_70;
      Operation::add_id(this,IVar4);
      local_74 = CapabilityStorageImageMultisample;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar2->capabilities,&local_74);
    }
    Converter::Impl::add(impl,this,pmVar7->rov);
  }
  return bVar11 && bVar3;
}

Assistant:

bool emit_texture_store_instruction_dispatch(Converter::Impl &impl, const llvm::CallInst *instruction, bool multi_sampled)
{
	auto &builder = impl.builder();

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));

	// Deferred 64-bit atomic. Resolve in a later AGS atomic.
	if (impl.ags.num_instructions == 2 &&
	    impl.ags.backdoor_instructions[0] == instruction->getOperand(2) && !multi_sampled)
	{
		impl.ags.active_uav_ptr = image_id;
		impl.ags.active_uav_op = DXIL::Op::TextureStore;
		return true;
	}

	const auto &meta = impl.handle_to_resource_meta[image_id];
	spv::Id coord[3] = {};

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	// Cubes are not supported here.
	if (num_coords_full > 3)
		return false;

	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 2));

	spv::Id write_values[4] = {};
	for (unsigned i = 0; i < 4; i++)
	{
		impl.register_externally_visible_write(instruction->getOperand(i + 5));
		write_values[i] = impl.get_id_for_value(instruction->getOperand(i + 5));
	}

	// Ignore write mask. We cannot do anything meaningful about it.
	// The write mask must cover all components in the image, and there is no "sliced write" support for typed resources.

	Operation *op = impl.allocate(spv::OpImageWrite);

	op->add_id(image_id);
	op->add_id(impl.build_vector(builder.makeUintType(32), coord, num_coords_full));

	spv::Id store_id = impl.build_vector(impl.get_type_id(instruction->getOperand(5)->getType()), write_values, 4);
	store_id = impl.fixup_store_type_typed(meta.component_type, 4, store_id);
	op->add_id(store_id);
	builder.addCapability(spv::CapabilityStorageImageWriteWithoutFormat);

	if (multi_sampled)
	{
		spv::Id sample_id = impl.get_id_for_value(instruction->getOperand(10));
		op->add_literal(spv::ImageOperandsSampleMask);
		op->add_id(sample_id);
		builder.addCapability(spv::CapabilityStorageImageMultisample);
	}

	impl.add(op, meta.rov);
	return true;
}